

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O0

bool cppwinrt::is_object(TypeSig *signature)

{
  value_type *variant;
  anon_class_1_0_00000001 local_21;
  anon_class_8_1_6424947d local_20;
  bool local_11;
  TypeSig *pTStack_10;
  bool object;
  TypeSig *signature_local;
  
  local_11 = false;
  pTStack_10 = signature;
  variant = winmd::reader::TypeSig::Type(signature);
  local_20.object = &local_11;
  call<std::variant<winmd::reader::ElementType,winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,winmd::reader::GenericTypeIndex,winmd::reader::GenericTypeInstSig,winmd::reader::GenericMethodTypeIndex>const&,cppwinrt::is_object(winmd::reader::TypeSig_const&)::__0,cppwinrt::is_object(winmd::reader::TypeSig_const&)::__1>
            (variant,&local_20,&local_21);
  return (bool)(local_11 & 1);
}

Assistant:

static bool is_object(TypeSig const& signature)
    {
        bool object{};

        call(signature.Type(),
            [&](ElementType type)
        {
            if (type == ElementType::Object)
            {
                object = true;
            }
        },
            [](auto&&) {});

        return object;
    }